

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O2

void WasmCGenBinary(WasmCGen *cgen,PCSTR function)

{
  w3SourceGenStack *this;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  printf("/*%s*/\n","WasmCGenBinary");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,function,&local_119);
  std::operator+(&local_d8,&local_38,"(");
  this = &(cgen->super_w3SourceGen).stack;
  w3SourceGenStack::pop_abi_cxx11_(&local_f8,this);
  std::operator+(&local_b8,&local_d8,&local_f8);
  std::operator+(&local_98,&local_b8,",");
  w3SourceGenStack::pop_abi_cxx11_(&local_118,this);
  std::operator+(&local_78,&local_98,&local_118);
  std::operator+(&local_58,&local_78,")");
  w3SourceGen::push(&cgen->super_w3SourceGen,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void WasmCGenBinary (WasmCGen* cgen, PCSTR function)
{
    printf ("/*%s*/\n", __func__);
    cgen->push (string (function) + "(" + cgen->pop () + "," + cgen->pop () + ")");
}